

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

RPCHelpMan * setmocktime(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffb48;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb50;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  allocator<char> *in_stack_fffffffffffffb88;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffffb90;
  RPCArgOptions *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  Fallback *in_stack_fffffffffffffba8;
  undefined1 skip_type_check;
  undefined8 in_stack_fffffffffffffbb0;
  Type type;
  vector<RPCResult,_std::allocator<RPCResult>_> *inner;
  string *in_stack_fffffffffffffbb8;
  string *description;
  RPCArg *in_stack_fffffffffffffbc0;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_3a9;
  pointer local_3a8;
  pointer pRStack_3a0;
  pointer local_398;
  undefined1 local_38a [26];
  undefined8 in_stack_fffffffffffffc90;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffc9c;
  undefined8 in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  RPCMethodImpl *in_stack_fffffffffffffdb0;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  type = (Type)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  this_01 = (RPCResult *)&stack0xfffffffffffffcbe;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  this_00 = (RPCResults *)&stack0xfffffffffffffc9f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  uVar3 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffb58,(Optional *)in_stack_fffffffffffffb50);
  std::operator+(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::string(in_stack_fffffffffffffb60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb48);
  RPCArg::RPCArg(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,type,in_stack_fffffffffffffba8,
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  result = (RPCResult *)&stack0xfffffffffffffc97;
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffb48);
  __l._M_len = (size_type)in_stack_fffffffffffffb98;
  __l._M_array = in_stack_fffffffffffffb90;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb88,__l,
             (allocator_type *)in_stack_fffffffffffffb80);
  description = (string *)(local_38a + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  inner = (vector<RPCResult,_std::allocator<RPCResult>_> *)local_38a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  local_3a8 = (pointer)0x0;
  pRStack_3a0 = (pointer)0x0;
  local_398 = (pointer)0x0;
  skip_type_check = (undefined1)((ulong)&local_3a8 >> 0x38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb48);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,description,inner,
             (bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffb48,(string *)0x677a54);
  this = (RPCArg *)&stack0xfffffffffffffc30;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<setmocktime()::__0,void>(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0,
             (string *)in_stack_fffffffffffffca8,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffca0,
             (RPCResults *)CONCAT44(in_stack_fffffffffffffc9c,uVar3),
             (RPCExamples *)in_stack_fffffffffffffc90,in_stack_fffffffffffffdb0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3a9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_38a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_38a + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc9f);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcbe);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcbf);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan setmocktime()
{
    return RPCHelpMan{"setmocktime",
        "\nSet the local time to given timestamp (-regtest only)\n",
        {
            {"timestamp", RPCArg::Type::NUM, RPCArg::Optional::NO, UNIX_EPOCH_TIME + "\n"
             "Pass 0 to go back to using the system time."},
        },
        RPCResult{RPCResult::Type::NONE, "", ""},
        RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    if (!Params().IsMockableChain()) {
        throw std::runtime_error("setmocktime is for regression testing (-regtest mode) only");
    }

    // For now, don't change mocktime if we're in the middle of validation, as
    // this could have an effect on mempool time-based eviction, as well as
    // IsCurrentForFeeEstimation() and IsInitialBlockDownload().
    // TODO: figure out the right way to synchronize around mocktime, and
    // ensure all call sites of GetTime() are accessing this safely.
    LOCK(cs_main);

    const int64_t time{request.params[0].getInt<int64_t>()};
    constexpr int64_t max_time{Ticks<std::chrono::seconds>(std::chrono::nanoseconds::max())};
    if (time < 0 || time > max_time) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Mocktime must be in the range [0, %s], not %s.", max_time, time));
    }

    SetMockTime(time);
    const NodeContext& node_context{EnsureAnyNodeContext(request.context)};
    for (const auto& chain_client : node_context.chain_clients) {
        chain_client->setMockTime(time);
    }

    return UniValue::VNULL;
},
    };
}